

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfft2dTestML.c
# Opt level: O0

void main(void)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  double dVar3;
  double dVar4;
  double dVar5;
  long in_stack_00000010;
  long in_stack_00000018;
  float *in_stack_00000020;
  long in_stack_00000028;
  float *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffa8;
  uint __seed;
  int rannum;
  uint randseed;
  FILE *fdataout;
  long M2;
  long M;
  long TheErr;
  long i1;
  float maxerrfft;
  float *a;
  long N;
  long N2;
  
  N = 0x40;
  a = (float *)0x100;
  __seed = 0x309;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",(ulong)__seed);
  srand(__seed);
  dVar3 = log((double)(long)a);
  lVar2 = lround(dVar3 * 1.4426950408889634);
  a = (float *)(1L << ((byte)lVar2 & 0x3f));
  dVar3 = log((double)N);
  lVar2 = lround(dVar3 * 1.4426950408889634);
  N = 1L << ((byte)lVar2 & 0x3f);
  printf("fft size = %6ld X%6ld,  ",N,a);
  iVar1 = fft2dInit((long)_rannum,CONCAT44(__seed,in_stack_ffffffffffffffa8));
  M = (long)iVar1;
  __ptr = malloc(N * (long)a * 4);
  if (__ptr == (void *)0x0) {
    M = 2;
  }
  if ((M == 0) && (_rannum = fopen("fftdat.dr2","wb"), _rannum == (FILE *)0x0)) {
    M = -0x32;
  }
  if (M == 0) {
    fwrite(&a,8,1,_rannum);
    fwrite(&N,8,1,_rannum);
    for (TheErr = 0; TheErr < N * (long)a; TheErr = TheErr + 1) {
      iVar1 = rand();
      *(float *)((long)__ptr + TheErr * 4) = (float)iVar1 * 9.313226e-10 + -1.0;
    }
    fwrite(__ptr,N * (long)a * 4,1,_rannum);
    rfft2d(in_stack_00000030,in_stack_00000028,(long)in_stack_00000020);
    fwrite(__ptr,N * (long)a * 4,1,_rannum);
    fclose(_rannum);
    rifft2d(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    i1._4_4_ = 0.0;
    srand(__seed);
    for (TheErr = 0; TheErr < N * (long)a; TheErr = TheErr + 1) {
      iVar1 = rand();
      dVar5 = (double)i1._4_4_;
      dVar4 = ABS(((double)iVar1 * 9.313225746154785e-10 + -1.0) -
                  (double)*(float *)((long)__ptr + TheErr * 4));
      dVar3 = dVar4;
      if (dVar4 <= dVar5) {
        dVar3 = dVar5;
      }
      i1._4_4_ = (float)(double)(~-(ulong)NAN(dVar5) & (ulong)dVar3 |
                                -(ulong)NAN(dVar5) & (ulong)dVar4);
    }
    printf("maxerr rfft = %6.4e\n",(double)i1._4_4_);
    free(__ptr);
    fft2dFree();
  }
  else {
    if (M == 2) {
      printf(" out of memory \n");
    }
    else {
      printf(" error \n");
    }
    fft2dFree();
  }
  printf(" Done. \n");
  return;
}

Assistant:

void main(){
long 	N2 = 64;	/* the number of rows in 2d ffts, must be power of 2 */
long 	N = 256;	/* the number of cols in 2d ffts, must be power of 2 */
float	*a;
float	maxerrfft;
long 	i1;
long 	TheErr;
long		M;
long		M2;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);
M2 = lround(LOG2(N2));
N2 = POW2(M2);

printf("fft size = %6ld X%6ld,  ", N2, N);

TheErr = 0;

if(!TheErr){
	TheErr = fft2dInit(M2, M);
}

a = (float *) malloc(N2*N*sizeof(float) );
if (a == 0) TheErr = 2;
if(!TheErr){
	fdataout = fopen("fftdat.dr2", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&N, sizeof(N), 1, fdataout);
	fwrite(&N2, sizeof(N2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i1=0; i1<N2*N; i1++){
		rannum = rand();
		a[i1] = BIPRAND(rannum);
	}
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	/* real, 2d fast fourier transform */
	rfft2d(a, M2, M);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);
	fclose(fdataout);

	/* compute and check inverse transform */
	rifft2d(a, M2, M);

	maxerrfft = 0;
	srand(randseed);
	for (i1=0; i1<N2*N; i1++){
		rannum = rand();
		maxerrfft = fmax(maxerrfft, fabs(BIPRAND(rannum)-a[i1]));
	}

	printf("maxerr rfft = %6.4e\n", maxerrfft);

	free(a);
	fft2dFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fft2dFree();
}
printf(" Done. \n");
return;
}